

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dl.c
# Opt level: O0

void chck_dl_unload(void *handle)

{
  void *handle_local;
  
  if (handle != (void *)0x0) {
    dlclose(handle);
    return;
  }
  __assert_fail("handle",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/dl/dl.c",0x58
                ,"void chck_dl_unload(void *)");
}

Assistant:

void
chck_dl_unload(void *handle)
{
   assert(handle);

#if defined(_WIN32) || defined(_WIN64)
   FreeLibrary((HMODULE)handle);
#elif defined(__posix__) || defined(__unix__) || defined(__linux__) || defined(__APPLE__)
   dlclose(handle);
#endif
}